

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkStrashBlifMv(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  void *__ptr;
  Vec_Ptr_t *pVVar4;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  Vec_Ptr_t *pVVar13;
  int Index;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  uint local_74;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18a,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLIFMV) {
    __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18b,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18c,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18d,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  local_74 = 2;
  for (iVar9 = 0; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar9);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 6)) &&
       (uVar1 = Abc_ObjMvVarNum(pAVar3), (int)local_74 <= (int)uVar1)) {
      local_74 = uVar1;
    }
  }
  iVar9 = Abc_Base2Log(local_74);
  __ptr = malloc((long)iVar9 << 3);
  Abc_NtkCleanCopy(pNtk);
  pVVar4 = Abc_NtkDfs(pNtk,0);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar5 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar5;
  Abc_NtkIncrementTravId(pNtk);
  for (iVar9 = 0; iVar10 = pNtk->vCis->nSize, iVar9 < iVar10; iVar9 = iVar9 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar9);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 2) {
      pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
      uVar2 = Abc_ObjMvVarNum(pAVar3);
      pvVar6 = malloc((long)(int)uVar2 * 8);
      uVar1 = Abc_Base2Log(uVar2);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
        pAVar7 = Abc_NtkCreatePi(pNtk_00);
        *(Abc_Obj_t **)((long)__ptr + uVar11 * 8) = pAVar7;
        if (local_74 == 2) {
          pcVar5 = Abc_ObjName(pAVar3);
          Abc_ObjAssignName(pAVar7,pcVar5,(char *)0x0);
        }
        else {
          Abc_NtkConvertAssignName(pAVar7,pAVar3,(int)uVar11);
        }
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      for (uVar11 = 0; uVar11 != uVar2; uVar11 = uVar11 + 1) {
        pAVar7 = Abc_AigConst1(pNtk_00);
        *(Abc_Obj_t **)((long)pvVar6 + uVar11 * 8) = pAVar7;
        for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
          pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar7,
                              (Abc_Obj_t *)
                              ((ulong)(((uint)uVar11 >> ((uint)uVar15 & 0x1f) & 1) == 0) ^
                              *(ulong *)((long)__ptr + uVar15 * 8)));
          *(Abc_Obj_t **)((long)pvVar6 + uVar11 * 8) = pAVar7;
        }
      }
      (pAVar3->field_6).pTemp = pvVar6;
      Abc_NodeSetTravIdCurrent(pAVar3);
    }
  }
  iVar9 = 0;
  for (iVar12 = 0; iVar12 < iVar10; iVar12 = iVar12 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar12);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 2) {
      pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
      uVar2 = Abc_ObjMvVarNum(pAVar3);
      pvVar6 = malloc((long)(int)uVar2 * 8);
      uVar1 = Abc_Base2Log(uVar2);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
        pAVar7 = Abc_NtkCreateBo(pNtk_00);
        *(Abc_Obj_t **)((long)__ptr + uVar11 * 8) = pAVar7;
        if (local_74 == 2) {
          pcVar5 = Abc_ObjName(pAVar3);
          Abc_ObjAssignName(pAVar7,pcVar5,(char *)0x0);
        }
        else {
          Abc_NtkConvertAssignName(pAVar7,pAVar3,(int)uVar11);
        }
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      for (uVar11 = 0; uVar11 != uVar2; uVar11 = uVar11 + 1) {
        pAVar7 = Abc_AigConst1(pNtk_00);
        *(Abc_Obj_t **)((long)pvVar6 + uVar11 * 8) = pAVar7;
        for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
          pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar7,
                              (Abc_Obj_t *)
                              ((ulong)(((uint)uVar11 >> ((uint)uVar15 & 0x1f) & 1) == 0) ^
                              *(ulong *)((long)__ptr + uVar15 * 8)));
          *(Abc_Obj_t **)((long)pvVar6 + uVar11 * 8) = pAVar7;
        }
      }
      iVar9 = iVar9 + uVar1;
      (pAVar3->field_6).pTemp = pvVar6;
      Abc_NodeSetTravIdCurrent(pAVar3);
    }
    iVar10 = pNtk->vCis->nSize;
  }
  iVar10 = 0;
  while (iVar10 < pVVar4->nSize) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pVVar4,iVar10);
    iVar12 = Abc_NodeStrashBlifMv(pNtk_00,pAVar3);
    iVar10 = iVar10 + 1;
    if (iVar12 == 0) goto LAB_00698f5b;
  }
  Vec_PtrFree(pVVar4);
  for (iVar10 = 0; iVar12 = pNtk->vCos->nSize, iVar10 < iVar12; iVar10 = iVar10 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar10);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 3) {
      pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      uVar1 = Abc_ObjMvVarNum(pAVar3);
      pvVar6 = (pAVar3->field_6).pTemp;
      iVar12 = Abc_Base2Log(uVar1);
      uVar15 = 0;
      uVar11 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar11 = uVar15;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      while (iVar14 = (int)uVar15, iVar14 != iVar12) {
        pAVar7 = Abc_AigConst1(pNtk_00);
        pAVar7 = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
        for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
          if ((1 << ((byte)uVar15 & 0x1f) & (uint)uVar16) != 0) {
            pAVar7 = Abc_AigOr((Abc_Aig_t *)pNtk_00->pManFunc,pAVar7,
                               *(Abc_Obj_t **)((long)pvVar6 + uVar16 * 8));
          }
        }
        pAVar8 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar8,pAVar7);
        if (local_74 == 2) {
          pcVar5 = Abc_ObjName(pAVar3);
          Abc_ObjAssignName(pAVar8,pcVar5,(char *)0x0);
        }
        else {
          Abc_NtkConvertAssignName(pAVar8,pAVar3,iVar14);
        }
        uVar15 = (ulong)(iVar14 + 1);
      }
    }
  }
  iVar14 = 0;
  for (iVar10 = 0; iVar10 < iVar12; iVar10 = iVar10 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar10);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 3) {
      pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      uVar1 = Abc_ObjMvVarNum(pAVar3);
      pvVar6 = (pAVar3->field_6).pTemp;
      iVar12 = Abc_Base2Log(uVar1);
      uVar15 = 0;
      uVar11 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar11 = uVar15;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      while (Index = (int)uVar15, Index != iVar12) {
        pAVar7 = Abc_AigConst1(pNtk_00);
        pAVar7 = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
        for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
          if ((1 << ((byte)uVar15 & 0x1f) & (uint)uVar16) != 0) {
            pAVar7 = Abc_AigOr((Abc_Aig_t *)pNtk_00->pManFunc,pAVar7,
                               *(Abc_Obj_t **)((long)pvVar6 + uVar16 * 8));
          }
        }
        pAVar8 = Abc_NtkCreateBi(pNtk_00);
        Abc_ObjAddFanin(pAVar8,pAVar7);
        if (local_74 == 2) {
          pcVar5 = Abc_ObjName(pAVar3);
          Abc_ObjAssignName(pAVar8,pcVar5,(char *)0x0);
        }
        else {
          Abc_NtkConvertAssignName(pAVar8,pAVar3,Index);
        }
        uVar15 = (ulong)(Index + 1);
      }
      iVar14 = iVar14 + iVar12;
    }
    iVar12 = pNtk->vCos->nSize;
  }
  if (pNtk->nObjCounts[8] != 0) {
    pVVar4 = Vec_PtrAlloc(pNtk_00->vPis->nSize);
    iVar10 = 0;
    while( true ) {
      pVVar13 = pNtk_00->vPis;
      iVar12 = pVVar13->nSize;
      if (iVar12 <= iVar10) break;
      pAVar3 = Abc_NtkPi(pNtk_00,iVar10);
      pcVar5 = Abc_ObjName(pAVar3);
      iVar12 = strncmp(pcVar5,"free_var_",9);
      if (iVar12 == 0) {
        Vec_PtrPush(pVVar4,pAVar3);
      }
      iVar10 = iVar10 + 1;
    }
    for (iVar10 = 0; iVar10 < iVar12; iVar10 = iVar10 + 1) {
      pAVar3 = Abc_NtkPi(pNtk_00,iVar10);
      pcVar5 = Abc_ObjName(pAVar3);
      iVar12 = strncmp(pcVar5,"free_var_",9);
      if (iVar12 != 0) {
        Vec_PtrPush(pVVar4,pAVar3);
      }
      pVVar13 = pNtk_00->vPis;
      iVar12 = pVVar13->nSize;
    }
    if (pVVar4->nSize != iVar12) {
      __assert_fail("Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vPis)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x299,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    Vec_PtrFree(pVVar13);
    pNtk_00->vPis = pVVar4;
    pVVar4 = Vec_PtrAlloc(pNtk_00->vCis->nSize);
    iVar10 = 0;
    while( true ) {
      pVVar13 = pNtk_00->vCis;
      iVar12 = pVVar13->nSize;
      if (iVar12 <= iVar10) break;
      pAVar3 = Abc_NtkCi(pNtk_00,iVar10);
      pcVar5 = Abc_ObjName(pAVar3);
      iVar12 = strncmp(pcVar5,"free_var_",9);
      if (iVar12 == 0) {
        Vec_PtrPush(pVVar4,pAVar3);
      }
      iVar10 = iVar10 + 1;
    }
    for (iVar10 = 0; iVar10 < iVar12; iVar10 = iVar10 + 1) {
      pAVar3 = Abc_NtkCi(pNtk_00,iVar10);
      pcVar5 = Abc_ObjName(pAVar3);
      iVar12 = strncmp(pcVar5,"free_var_",9);
      if (iVar12 != 0) {
        Vec_PtrPush(pVVar4,pAVar3);
      }
      pVVar13 = pNtk_00->vCis;
      iVar12 = pVVar13->nSize;
    }
    if (pVVar4->nSize != iVar12) {
      __assert_fail("Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vCis)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x2a4,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    Vec_PtrFree(pVVar13);
    pNtk_00->vCis = pVVar4;
    if (iVar9 != iVar14) {
      __assert_fail("nCount1 == nCount2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x2a8,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    iVar10 = 0;
    if (0 < iVar9) {
      iVar10 = iVar9;
    }
    iVar9 = -iVar9;
    while (bVar17 = iVar10 != 0, iVar10 = iVar10 + -1, bVar17) {
      pAVar3 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_LATCH);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
      }
      pAVar3->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      pcVar5 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar3,pcVar5,(char *)0x0);
      pAVar7 = Abc_NtkCo(pNtk_00,pNtk_00->vCos->nSize + iVar9);
      pAVar8 = Abc_NtkCi(pNtk_00,pNtk_00->vCis->nSize + iVar9);
      Abc_ObjAddFanin(pAVar3,pAVar7);
      Abc_ObjAddFanin(pAVar8,pAVar3);
      iVar9 = iVar9 + 1;
    }
  }
  free(__ptr);
  for (iVar9 = 0; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar9);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).pTemp != (void *)0x0)) {
      free((pAVar3->field_6).pTemp);
      (pAVar3->field_6).pTemp = (void *)0x0;
    }
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
  iVar9 = Abc_NtkCheck(pNtk_00);
  if (iVar9 == 0) {
    fwrite("Abc_NtkStrashBlifMv(): Network check has failed.\n",0x31,1,_stdout);
LAB_00698f5b:
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStrashBlifMv( Abc_Ntk_t * pNtk )
{
    int fUsePositional = 0;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t ** pBits;
    Abc_Obj_t ** pValues;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pTemp, * pBit, * pNet;
    int i, k, v, nValues, nValuesMax, nBits;
    int nCount1, nCount2;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );

    // get the largest number of values
    nValuesMax = 2;
    Abc_NtkForEachNet( pNtk, pObj, i )
    {
        nValues = Abc_ObjMvVarNum(pObj);
        if ( nValuesMax < nValues )
            nValuesMax = nValues;
    }
    nBits = Abc_Base2Log( nValuesMax );
    pBits = ABC_ALLOC( Abc_Obj_t *, nBits );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // collect the nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
//    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pName );

    nCount1 = nCount2 = 0;
    // encode the CI nets
    Abc_NtkIncrementTravId( pNtk );
    if ( fUsePositional )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_NtkCreatePi( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pValues[v], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pValues[v], pNet, v );
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_NtkCreateBo( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pValues[v], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pValues[v], pNet, v );
                nCount1++;
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the encoding bits
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBits[k] = Abc_NtkCreatePi( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pBits[k], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pBits[k], pNet, k );
            }
            // encode the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_AigConst1(pNtkNew);
                for ( k = 0; k < nBits; k++ )
                {
                    pBit = Abc_ObjNotCond( pBits[k], (v&(1<<k)) == 0 );
                    pValues[v] = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[v], pBit );
                }
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the encoding bits
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBits[k] = Abc_NtkCreateBo( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pBits[k], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pBits[k], pNet, k );
                nCount1++;
            }
            // encode the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_AigConst1(pNtkNew);
                for ( k = 0; k < nBits; k++ )
                {
                    pBit = Abc_ObjNotCond( pBits[k], (v&(1<<k)) == 0 );
                    pValues[v] = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[v], pBit );
                }
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }

    // process nodes in the topological order
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Abc_NodeStrashBlifMv( pNtkNew, pObj ) )
        {
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
    Vec_PtrFree( vNodes );

    // encode the CO nets
    if ( fUsePositional )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            for ( v = 0; v < nValues; v++ )
            {
                pTemp = Abc_NtkCreatePo( pNtkNew );
                Abc_ObjAddFanin( pTemp, pValues[v] );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, v );
            }
        }
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            for ( v = 0; v < nValues; v++ )
            {
                pTemp = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pTemp, pValues[v] );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, v );
                nCount2++;
            }
        }
    }
    else // if ( fPositional == 0 )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBit = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    if ( v & (1<<k) )
                        pBit = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pBit, pValues[v] );
                pTemp = Abc_NtkCreatePo( pNtkNew );
                Abc_ObjAddFanin( pTemp, pBit );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, k );
            }
        }
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBit = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    if ( v & (1<<k) )
                        pBit = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pBit, pValues[v] );
                pTemp = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pTemp, pBit );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, k );
                nCount2++;
            }
        }
    }

    if ( Abc_NtkLatchNum(pNtk) )
    {
        Vec_Ptr_t * vTemp;
        Abc_Obj_t * pLatch, * pObjLi, * pObjLo;
        int i;
        // move free vars to the front among the PIs
        vTemp = Vec_PtrAlloc( Vec_PtrSize(pNtkNew->vPis) );
        Abc_NtkForEachPi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) == 0 )
                Vec_PtrPush( vTemp, pObj );
        Abc_NtkForEachPi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) != 0 )
                Vec_PtrPush( vTemp, pObj );
        assert( Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vPis) );
        Vec_PtrFree( pNtkNew->vPis );
        pNtkNew->vPis = vTemp;
        // move free vars to the front among the CIs
        vTemp = Vec_PtrAlloc( Vec_PtrSize(pNtkNew->vCis) );
        Abc_NtkForEachCi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) == 0 )
                Vec_PtrPush( vTemp, pObj );
        Abc_NtkForEachCi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) != 0 )
                Vec_PtrPush( vTemp, pObj );
        assert( Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vCis) );
        Vec_PtrFree( pNtkNew->vCis );
        pNtkNew->vCis = vTemp;
        // create registers
        assert( nCount1 == nCount2 );
        for ( i = 0; i < nCount1; i++ )
        {
            // create latch
            pLatch = Abc_NtkCreateLatch( pNtkNew );
            Abc_LatchSetInit0( pLatch );
            Abc_ObjAssignName( pLatch, Abc_ObjName(pLatch), NULL );
            // connect
            pObjLi = Abc_NtkCo( pNtkNew, Abc_NtkCoNum(pNtkNew)-nCount1+i );
            pObjLo = Abc_NtkCi( pNtkNew, Abc_NtkCiNum(pNtkNew)-nCount1+i );
            Abc_ObjAddFanin( pLatch, pObjLi );
            Abc_ObjAddFanin( pObjLo, pLatch );
        }
    }

    // cleanup
    ABC_FREE( pBits );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy )
            ABC_FREE( pObj->pCopy );

    // remove dangling nodes
    i = Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
//    printf( "Cleanup removed %d nodes.\n", i );
//    Abc_NtkReassignIds( pNtkNew );

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkStrashBlifMv(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}